

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall MIDIStreamer::Play(MIDIStreamer *this,bool looping,int subsong)

{
  bool bVar1;
  EMidiDevice devtype_00;
  uint uVar2;
  int iVar3;
  OPLDumperMIDIDevice *this_00;
  char *pcVar4;
  TimidityWaveWriterMIDIDevice *this_01;
  MIDIDevice *pMVar5;
  EMidiDevice devtype;
  DWORD tid;
  int subsong_local;
  bool looping_local;
  MIDIStreamer *this_local;
  
  (this->super_MusInfo).m_Status = STATE_Stopped;
  (this->super_MusInfo).m_Looping = looping;
  this->EndQueued = 0;
  this->VolumeChanged = false;
  this->Restarting = true;
  this->InitialPlayback = true;
  if (this->MIDI != (MIDIDevice *)0x0) {
    __assert_fail("MIDI == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                  ,0x142,"virtual void MIDIStreamer::Play(bool, int)");
  }
  devtype_00 = SelectMIDIDevice(this->DeviceType);
  bVar1 = FString::IsNotEmpty(&this->DumpFilename);
  if (bVar1) {
    if (devtype_00 == MDEV_OPL) {
      this_00 = (OPLDumperMIDIDevice *)operator_new(0xcf8);
      pcVar4 = FString::operator_cast_to_char_(&this->DumpFilename);
      OPLDumperMIDIDevice::OPLDumperMIDIDevice(this_00,pcVar4);
      this->MIDI = (MIDIDevice *)this_00;
    }
    else if (devtype_00 == MDEV_GUS) {
      this_01 = (TimidityWaveWriterMIDIDevice *)operator_new(0x70);
      pcVar4 = FString::operator_cast_to_char_(&this->DumpFilename);
      TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice(this_01,pcVar4,0);
      this->MIDI = (MIDIDevice *)this_01;
    }
  }
  else {
    pMVar5 = CreateMIDIDevice(this,devtype_00);
    this->MIDI = pMVar5;
  }
  bVar1 = true;
  if (this->MIDI != (MIDIDevice *)0x0) {
    uVar2 = (*this->MIDI->_vptr_MIDIDevice[0x10])();
    bVar1 = (uVar2 & 1) == 0;
  }
  if (bVar1) {
    if ((this->MIDI == (MIDIDevice *)0x0) ||
       (iVar3 = (*this->MIDI->_vptr_MIDIDevice[2])(this->MIDI,Callback), iVar3 != 0)) {
      Printf(200,"Could not open MIDI out device\n");
      if (this->MIDI != (MIDIDevice *)0x0) {
        if (this->MIDI != (MIDIDevice *)0x0) {
          (*this->MIDI->_vptr_MIDIDevice[1])();
        }
        this->MIDI = (MIDIDevice *)0x0;
      }
    }
    else {
      (*(this->super_MusInfo)._vptr_MusInfo[0x1b])(this,(ulong)(uint)subsong);
      uVar2 = (*this->MIDI->_vptr_MIDIDevice[5])();
      (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,(ulong)uVar2);
      uVar2 = (*this->MIDI->_vptr_MIDIDevice[0x17])(this->MIDI,this,(ulong)looping & 1);
      if (((uVar2 & 1) == 0) ||
         ((*(this->super_MusInfo)._vptr_MusInfo[0x15])(), this->MIDI != (MIDIDevice *)0x0)) {
        iVar3 = (*this->MIDI->_vptr_MIDIDevice[10])();
        if (iVar3 == 0) {
          (this->super_MusInfo).m_Status = STATE_Playing;
        }
        else {
          Printf("Starting MIDI playback failed\n");
          (*(this->super_MusInfo)._vptr_MusInfo[7])();
        }
      }
    }
    return;
  }
  __assert_fail("MIDI == NULL || MIDI->NeedThreadedCallback() == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                ,0x155,"virtual void MIDIStreamer::Play(bool, int)");
}

Assistant:

void MIDIStreamer::Play(bool looping, int subsong)
{
	DWORD tid;
	EMidiDevice devtype;

	m_Status = STATE_Stopped;
	m_Looping = looping;
	EndQueued = 0;
	VolumeChanged = false;
	Restarting = true;
	InitialPlayback = true;

	assert(MIDI == NULL);
	devtype = SelectMIDIDevice(DeviceType);
	if (DumpFilename.IsNotEmpty())
	{
		if (devtype == MDEV_OPL)
		{
			MIDI = new OPLDumperMIDIDevice(DumpFilename);
		}
		else if (devtype == MDEV_GUS)
		{
			MIDI = new TimidityWaveWriterMIDIDevice(DumpFilename, 0);
		}
	}
	else
	{
		MIDI = CreateMIDIDevice(devtype);
	}
	
#ifndef _WIN32
	assert(MIDI == NULL || MIDI->NeedThreadedCallback() == false);
#endif

	if (MIDI == NULL || 0 != MIDI->Open(Callback, this))
	{
		Printf(PRINT_BOLD, "Could not open MIDI out device\n");
		if (MIDI != NULL)
		{
			delete MIDI;
			MIDI = NULL;
		}
		return;
	}

	SetMIDISubsong(subsong);
	CheckCaps(MIDI->GetTechnology());

	if (MIDI->Preprocess(this, looping))
	{
		StartPlayback();
		if (MIDI == NULL)
		{ // The MIDI file had no content and has been automatically closed.
			return;
		}
	}

	if (0 != MIDI->Resume())
	{
		Printf ("Starting MIDI playback failed\n");
		Stop();
	}
	else
	{
#ifdef _WIN32
		if (MIDI->NeedThreadedCallback())
		{
			PlayerThread = CreateThread(NULL, 0, PlayerProc, this, 0, &tid);
			if (PlayerThread == NULL)
			{
				Printf ("Creating MIDI thread failed\n");
				Stop();
			}
			else
			{
				m_Status = STATE_Playing;
			}
		}
		else
#endif
		{
			m_Status = STATE_Playing;
		}
	}
}